

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall
wabt::WastParser::ParseBlockInstr
          (WastParser *this,unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  Expr *pEVar1;
  char *pcVar2;
  size_type sVar3;
  undefined8 uVar4;
  IfExceptExpr *pIVar5;
  bool bVar6;
  TokenType TVar7;
  Result RVar8;
  undefined8 uVar9;
  Token local_1a8;
  Token local_158;
  Token local_108;
  undefined1 auStack_b8 [8];
  Location loc;
  Token local_78;
  IfExceptExpr *local_28;
  
  GetToken(&local_78,this);
  loc.filename.size_ = (size_type)local_78.loc.field_1.field_1.offset;
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       local_78.loc.field_1._8_8_;
  auStack_b8 = (undefined1  [8])local_78.loc.filename.data_;
  loc.filename.data_ = (char *)local_78.loc.filename.size_;
  Token::~Token(&local_78);
  TVar7 = Peek(this,0);
  if ((int)TVar7 < 0x40) {
    if (TVar7 != Block) {
      if (TVar7 != IfExcept) {
LAB_00f5f317:
        __assert_fail("!\"ParseBlockInstr should only be called when IsBlockInstr() is true\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/wast-parser.cc"
                      ,0x72d,"Result wabt::WastParser::ParseBlockInstr(std::unique_ptr<Expr> *)");
      }
      Consume(&local_78,this);
      ErrorUnlessOpcodeEnabled(this,&local_78);
      Token::~Token(&local_78);
      MakeUnique<wabt::IfExceptExpr,wabt::Location&>((wabt *)&local_28,(Location *)auStack_b8);
      RVar8 = ParseIfExceptHeader(this,local_28);
      uVar9 = local_28;
      if ((RVar8.enum_ != Error) &&
         (RVar8 = ParseInstrList(this,&(local_28->true_).exprs), uVar9 = local_28,
         RVar8.enum_ != Error)) {
        GetToken(&local_78,this);
        uVar4 = local_78.loc.field_1._8_8_;
        uVar9 = local_78.loc.field_1.field_1.offset;
        sVar3 = local_78.loc.filename.size_;
        loc.field_1._8_8_ = local_78.loc.filename.data_;
        Token::~Token(&local_78);
        (local_28->true_).end_loc.field_1.field_1.offset = uVar9;
        *(undefined8 *)((long)&(local_28->true_).end_loc.field_1 + 8) = uVar4;
        (local_28->true_).end_loc.filename.data_ = loc.field_1._8_8_;
        (local_28->true_).end_loc.filename.size_ = sVar3;
        bVar6 = Match(this,Else);
        if (bVar6) {
          RVar8 = ParseEndLabelOpt(this,&(local_28->true_).label);
          uVar9 = local_28;
          if ((RVar8.enum_ == Error) ||
             (RVar8 = ParseTerminatingInstrList(this,&local_28->false_), uVar9 = local_28,
             RVar8.enum_ == Error)) goto LAB_00f5f277;
          GetLocation(&local_78.loc,this);
          (local_28->false_end_loc).field_1.field_1.offset =
               (size_t)local_78.loc.field_1.field_1.offset;
          *(undefined8 *)((long)&(local_28->false_end_loc).field_1 + 8) = local_78.loc.field_1._8_8_
          ;
          (local_28->false_end_loc).filename.data_ = local_78.loc.filename.data_;
          (local_28->false_end_loc).filename.size_ = local_78.loc.filename.size_;
        }
        RVar8 = Expect(this,End);
        uVar9 = local_28;
        if ((RVar8.enum_ != Error) &&
           (RVar8 = ParseEndLabelOpt(this,&(local_28->true_).label), pIVar5 = local_28,
           uVar9 = local_28, RVar8.enum_ != Error)) {
          local_28 = (IfExceptExpr *)0x0;
          pEVar1 = (out_expr->_M_t).
                   super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
                   super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                   super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
          (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
          super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)pIVar5;
          if (pEVar1 == (Expr *)0x0) {
            return (Result)Ok;
          }
          (*pEVar1->_vptr_Expr[1])();
          uVar9 = local_28;
          goto LAB_00f5f305;
        }
      }
      goto LAB_00f5f277;
    }
    Consume(&local_1a8,this);
    Token::~Token(&local_1a8);
    MakeUnique<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Location&>
              ((wabt *)&local_78,(Location *)auStack_b8);
    RVar8 = ParseLabelOpt(this,(string *)((long)local_78.loc.filename.data_ + 0x40));
    uVar9 = local_78.loc.filename.data_;
    if (((RVar8.enum_ == Error) ||
        (RVar8 = ParseBlock(this,(Block *)((long)local_78.loc.filename.data_ + 0x40)),
        uVar9 = local_78.loc.filename.data_, RVar8.enum_ == Error)) ||
       (RVar8 = Expect(this,End), uVar9 = local_78.loc.filename.data_, RVar8.enum_ == Error))
    goto LAB_00f5f277;
    RVar8 = ParseEndLabelOpt(this,(string *)((long)local_78.loc.filename.data_ + 0x40));
  }
  else {
    if (TVar7 == If) {
      Consume(&local_108,this);
      Token::~Token(&local_108);
      MakeUnique<wabt::IfExpr,wabt::Location&>
                ((wabt *)(loc.field_1.field2 + 8),(Location *)auStack_b8);
      RVar8 = ParseLabelOpt(this,(string *)(loc.field_1._8_8_ + 0x40));
      uVar9 = loc.field_1._8_8_;
      if ((RVar8.enum_ == Error) ||
         (RVar8 = ParseBlock(this,(Block *)(loc.field_1._8_8_ + 0x40)), uVar9 = loc.field_1._8_8_,
         RVar8.enum_ == Error)) goto LAB_00f5f277;
      bVar6 = Match(this,Else);
      if (bVar6) {
        RVar8 = ParseEndLabelOpt(this,(string *)(loc.field_1._8_8_ + 0x40));
        uVar9 = loc.field_1._8_8_;
        if ((RVar8.enum_ == Error) ||
           (RVar8 = ParseTerminatingInstrList(this,(ExprList *)(loc.field_1._8_8_ + 0x118)),
           uVar9 = loc.field_1._8_8_, RVar8.enum_ == Error)) goto LAB_00f5f277;
        GetLocation(&local_78.loc,this);
        ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
        (loc.field_1._8_8_ + 0x140))->offset = (size_t)local_78.loc.field_1.field_1.offset;
        *(undefined8 *)(loc.field_1._8_8_ + 0x148) = local_78.loc.field_1._8_8_;
        *(char **)(loc.field_1._8_8_ + 0x130) = local_78.loc.filename.data_;
        *(size_type *)(loc.field_1._8_8_ + 0x138) = local_78.loc.filename.size_;
      }
      RVar8 = Expect(this,End);
      uVar9 = loc.field_1._8_8_;
      if ((RVar8.enum_ == Error) ||
         (RVar8 = ParseEndLabelOpt(this,(string *)(loc.field_1._8_8_ + 0x40)),
         uVar9 = loc.field_1._8_8_, RVar8.enum_ == Error)) goto LAB_00f5f277;
      loc.field_1._8_8_ = 0;
      pEVar1 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
               _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
               super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
      (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)uVar9;
      if (pEVar1 == (Expr *)0x0) {
        return (Result)Ok;
      }
      (*pEVar1->_vptr_Expr[1])();
      uVar9 = loc.field_1._8_8_;
      goto LAB_00f5f305;
    }
    if (TVar7 == Loop) {
      Consume(&local_158,this);
      Token::~Token(&local_158);
      MakeUnique<wabt::BlockExprBase<(wabt::ExprType)22>,wabt::Location&>
                ((wabt *)&local_78,(Location *)auStack_b8);
      RVar8 = ParseLabelOpt(this,(string *)((long)local_78.loc.filename.data_ + 0x40));
      uVar9 = local_78.loc.filename.data_;
      if (((RVar8.enum_ == Error) ||
          (RVar8 = ParseBlock(this,(Block *)((long)local_78.loc.filename.data_ + 0x40)),
          uVar9 = local_78.loc.filename.data_, RVar8.enum_ == Error)) ||
         (RVar8 = Expect(this,End), uVar9 = local_78.loc.filename.data_, RVar8.enum_ == Error))
      goto LAB_00f5f277;
      RVar8 = ParseEndLabelOpt(this,(string *)((long)local_78.loc.filename.data_ + 0x40));
    }
    else {
      if (TVar7 != Try) goto LAB_00f5f317;
      Consume(&local_78,this);
      ErrorUnlessOpcodeEnabled(this,&local_78);
      Token::~Token(&local_78);
      MakeUnique<wabt::TryExpr,wabt::Location&>((wabt *)&local_78,(Location *)auStack_b8);
      RVar8 = ParseLabelOpt(this,(string *)((long)local_78.loc.filename.data_ + 0x40));
      uVar9 = local_78.loc.filename.data_;
      if ((((RVar8.enum_ == Error) ||
           (RVar8 = ParseBlock(this,(Block *)((long)local_78.loc.filename.data_ + 0x40)),
           uVar9 = local_78.loc.filename.data_, RVar8.enum_ == Error)) ||
          ((RVar8 = Expect(this,Catch), uVar9 = local_78.loc.filename.data_, RVar8.enum_ == Error ||
           ((RVar8 = ParseEndLabelOpt(this,(string *)((long)local_78.loc.filename.data_ + 0x40)),
            uVar9 = local_78.loc.filename.data_, RVar8.enum_ == Error ||
            (RVar8 = ParseTerminatingInstrList
                               (this,(ExprList *)((long)local_78.loc.filename.data_ + 0x118)),
            uVar9 = local_78.loc.filename.data_, RVar8.enum_ == Error)))))) ||
         (RVar8 = Expect(this,End), uVar9 = local_78.loc.filename.data_, RVar8.enum_ == Error))
      goto LAB_00f5f277;
      RVar8 = ParseEndLabelOpt(this,(string *)((long)local_78.loc.filename.data_ + 0x40));
    }
  }
  pcVar2 = local_78.loc.filename.data_;
  uVar9 = local_78.loc.filename.data_;
  if (RVar8.enum_ == Error) {
LAB_00f5f277:
    if ((IfExceptExpr *)uVar9 != (IfExceptExpr *)0x0) {
      (*(((IfExceptExpr *)uVar9)->super_ExprMixin<(wabt::ExprType)20>).super_Expr._vptr_Expr[1])();
    }
    return (Result)Error;
  }
  local_78.loc.filename.data_ = (char *)0x0;
  pEVar1 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t
           .super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
           super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
  (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
  super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)pcVar2;
  if (pEVar1 == (Expr *)0x0) {
    return (Result)Ok;
  }
  (*pEVar1->_vptr_Expr[1])();
  uVar9 = local_78.loc.filename.data_;
LAB_00f5f305:
  if ((IfExceptExpr *)uVar9 != (IfExceptExpr *)0x0) {
    (*(((IfExceptExpr *)uVar9)->super_ExprMixin<(wabt::ExprType)20>).super_Expr._vptr_Expr[1])();
  }
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseBlockInstr(std::unique_ptr<Expr>* out_expr) {
  WABT_TRACE(ParseBlockInstr);
  Location loc = GetLocation();

  switch (Peek()) {
    case TokenType::Block: {
      Consume();
      auto expr = MakeUnique<BlockExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Loop: {
      Consume();
      auto expr = MakeUnique<LoopExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::If: {
      Consume();
      auto expr = MakeUnique<IfExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->true_.label));
      CHECK_RESULT(ParseBlock(&expr->true_));
      if (Match(TokenType::Else)) {
        CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
        CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
        expr->false_end_loc = GetLocation();
      }
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::IfExcept: {
      ErrorUnlessOpcodeEnabled(Consume());
      auto expr = MakeUnique<IfExceptExpr>(loc);
      CHECK_RESULT(ParseIfExceptHeader(expr.get()));
      CHECK_RESULT(ParseInstrList(&expr->true_.exprs));
      expr->true_.end_loc = GetLocation();
      if (Match(TokenType::Else)) {
        CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
        CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
        expr->false_end_loc = GetLocation();
      }
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Try: {
      ErrorUnlessOpcodeEnabled(Consume());
      auto expr = MakeUnique<TryExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      EXPECT(Catch);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      CHECK_RESULT(ParseTerminatingInstrList(&expr->catch_));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    default:
      assert(
          !"ParseBlockInstr should only be called when IsBlockInstr() is true");
      return Result::Error;
  }

  return Result::Ok;
}